

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O1

mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip,mz_uint flags)

{
  ushort *puVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  mz_zip_internal_state *pmVar5;
  bool bVar6;
  mz_bool mVar7;
  uint uVar8;
  size_t sVar9;
  long lVar10;
  size_t sVar11;
  short *__ptr;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  short *__ptr_00;
  int *piVar23;
  mz_uint64 mVar24;
  mz_uint64 mVar25;
  ulong __size;
  char cVar26;
  mz_uint32 zip64_end_of_central_dir_header_u32 [14];
  mz_uint32 zip64_end_of_central_dir_locator_u32 [5];
  mz_uint32 buf_u32 [1024];
  uint8_t local_10a8 [4];
  ulong local_10a4;
  uint local_1098;
  uint local_1094;
  uint local_1090;
  char local_108c;
  char local_108b;
  char local_108a;
  char local_1089;
  mz_uint32 local_1088;
  char local_1084;
  char local_1083;
  char local_1082;
  char local_1081;
  uint local_1080;
  char local_107c;
  char local_107b;
  char local_107a;
  char local_1079;
  ulong local_1078;
  ulong local_1070;
  ulong local_1068;
  size_t local_1060;
  int local_1058 [2];
  ulong local_1050;
  int local_1048;
  undefined4 local_1038;
  ushort local_1034;
  ushort local_1032;
  ushort local_1030;
  ushort local_102e;
  uint local_102c;
  uint local_1028;
  
  uVar18 = pZip->m_archive_size;
  if (uVar18 < 0x16) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_NOT_AN_ARCHIVE;
      return 0;
    }
    return 0;
  }
  mVar24 = 0;
  if (0x1000 < (long)uVar18) {
    mVar24 = uVar18 - 0x1000;
  }
  do {
    uVar18 = pZip->m_archive_size - mVar24;
    sVar11 = 0x1000;
    if (uVar18 < 0x1000) {
      sVar11 = uVar18;
    }
    sVar9 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar24,&local_1038,sVar11);
    cVar26 = '\x01';
    if (sVar9 == sVar11) {
      if (3 < uVar18) {
        uVar18 = (ulong)((int)sVar11 - 4);
        lVar16 = (long)&local_1038 + uVar18 + 3;
        lVar10 = -(uVar18 + mVar24);
        iVar13 = (int)sVar11 + -3;
        do {
          if ((*(int *)(lVar16 + -3) == 0x6054b50) && (0x15 < pZip->m_archive_size + lVar10)) {
            cVar26 = '\x02';
            mVar24 = -lVar10;
            goto LAB_00107d66;
          }
          lVar16 = lVar16 + -1;
          lVar10 = lVar10 + 1;
          iVar21 = iVar13 + -1;
          bVar6 = 0 < iVar13;
          iVar13 = iVar21;
        } while (iVar21 != 0 && bVar6);
      }
      if (mVar24 != 0) {
        cVar26 = 0x10014 < pZip->m_archive_size - mVar24;
        if (!(bool)cVar26) {
          mVar24 = mVar24 - 0xffd;
        }
      }
    }
LAB_00107d66:
  } while (cVar26 == '\0');
  if (cVar26 != '\x02') {
    pZip->m_last_error = MZ_ZIP_FAILED_FINDING_CENTRAL_DIR;
    return 0;
  }
  sVar11 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar24,&local_1038,0x16);
  if (sVar11 == 0x16) {
    if (local_1038 == 0x6054b50) {
      if (((0x4b < (long)mVar24) &&
          (sVar11 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar24 - 0x14,local_1058,0x14),
          sVar11 == 0x14)) && (local_1058[0] == 0x7064b50)) {
        pZip->m_pState->m_zip64 = 1;
      }
      if ((pZip->m_pState->m_zip64 == 0) ||
         ((0x4b < (long)mVar24 &&
          ((mVar7 = mz_zip_reader_eocd64_valid(pZip,mVar24 - 0x4c,local_10a8), mVar7 != 0 ||
           ((local_1050 <= pZip->m_archive_size - 0x38 &&
            (mVar7 = mz_zip_reader_eocd64_valid(pZip,local_1050,local_10a8), mVar7 != 0)))))))) {
        pZip->m_total_files = (uint)local_102e;
        uVar8 = (uint)local_1030;
        uVar22 = (uint)local_1034;
        uVar12 = (uint)local_1032;
        uVar18 = (ulong)local_1028;
        pmVar5 = pZip->m_pState;
        iVar13 = pmVar5->m_zip64;
        uVar20 = local_102c;
        if (iVar13 != 0) {
          if (local_10a4 < 0x2c) {
            pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
LAB_00107efe:
            bVar6 = false;
            local_1078 = uVar18;
            local_1090 = uVar8;
            local_1094 = uVar12;
          }
          else {
            if (local_1048 != 1) {
              pZip->m_last_error = MZ_ZIP_UNSUPPORTED_MULTIDISK;
              goto LAB_00107efe;
            }
            if (((local_1084 != '\0' || local_1083 != '\0') || local_1082 != '\0') ||
                local_1081 != '\0') {
              pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
              goto LAB_00107efe;
            }
            pZip->m_total_files = local_1088;
            if (((local_108c == '\0' && local_108b == '\0') && local_108a == '\0') &&
                local_1089 == '\0') {
              if (((local_107c != '\0' || local_107b != '\0') || local_107a != '\0') ||
                  local_1079 != '\0') {
                pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
                goto LAB_00108011;
              }
              bVar6 = true;
              uVar20 = local_1080;
              uVar22 = local_1098;
            }
            else {
              pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
              local_1090 = uVar8;
LAB_00108011:
              bVar6 = false;
              local_1078 = uVar18;
              local_1094 = uVar12;
            }
          }
          uVar18 = local_1078;
          uVar8 = local_1090;
          uVar12 = local_1094;
          if (!bVar6) {
            return 0;
          }
        }
        uVar4 = pZip->m_total_files;
        if ((uVar4 != uVar8) || ((uVar22 != 0 || uVar12 != 0 && ((uVar22 != 1 || (uVar12 != 1))))))
        {
          pZip->m_last_error = MZ_ZIP_UNSUPPORTED_MULTIDISK;
          return 0;
        }
        uVar17 = (ulong)uVar20;
        uVar14 = (ulong)uVar4 * 0x2e;
        if (uVar17 <= uVar14 && uVar14 - uVar17 != 0) {
LAB_00107f51:
          pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
          return 0;
        }
        uVar14 = uVar17 + uVar18;
        uVar19 = pZip->m_archive_size;
        if ((uVar19 < uVar14) || (mVar25 = mVar24 - uVar14, mVar24 < uVar14)) goto LAB_00107f51;
        if (iVar13 != 0) {
          if (mVar25 < 0x4c) goto LAB_00107f51;
          mVar25 = mVar25 - 0x4c;
        }
        if (((pZip->m_zip_type & ~MZ_ZIP_TYPE_USER) == MZ_ZIP_TYPE_FILE) &&
           (pmVar5->m_file_archive_start_ofs == 0)) {
          pmVar5->m_file_archive_start_ofs = mVar25;
          pZip->m_archive_size = uVar19 - mVar25;
        }
        pZip->m_central_directory_file_ofs = uVar18;
        if ((ulong)uVar4 == 0) {
LAB_001083a9:
          if ((flags >> 0xb & 1) == 0) {
            mz_zip_reader_sort_central_dir_offsets_by_filename(pZip);
            return 1;
          }
          return 1;
        }
        if (((pmVar5->m_central_dir).m_capacity < uVar17) &&
           (mVar7 = mz_zip_array_ensure_capacity(pZip,&pmVar5->m_central_dir,uVar17,0), mVar7 == 0))
        {
LAB_001083dc:
          pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
          return 0;
        }
        (pmVar5->m_central_dir).m_size = uVar17;
        pmVar5 = pZip->m_pState;
        uVar14 = (ulong)pZip->m_total_files;
        if (((pmVar5->m_central_dir_offsets).m_capacity < uVar14) &&
           (mVar7 = mz_zip_array_ensure_capacity(pZip,&pmVar5->m_central_dir_offsets,uVar14,0),
           mVar7 == 0)) goto LAB_001083dc;
        (pmVar5->m_central_dir_offsets).m_size = uVar14;
        if ((flags >> 0xb & 1) == 0) {
          pmVar5 = pZip->m_pState;
          uVar14 = (ulong)pZip->m_total_files;
          if (((pmVar5->m_sorted_central_dir_offsets).m_capacity < uVar14) &&
             (mVar7 = mz_zip_array_ensure_capacity
                                (pZip,&pmVar5->m_sorted_central_dir_offsets,uVar14,0), mVar7 == 0))
          {
            pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
            return 0;
          }
          (pmVar5->m_sorted_central_dir_offsets).m_size = uVar14;
        }
        sVar11 = (*pZip->m_pRead)(pZip->m_pIO_opaque,uVar18,(pZip->m_pState->m_central_dir).m_p,
                                  uVar17);
        if (sVar11 == uVar17) {
          if (pZip->m_total_files != 0) {
            piVar23 = (int *)(pZip->m_pState->m_central_dir).m_p;
            uVar14 = 0;
            do {
              if ((uVar20 < 0x2e) || (*piVar23 != 0x2014b50)) goto LAB_00108333;
              pmVar5 = pZip->m_pState;
              *(int *)((long)(pmVar5->m_central_dir_offsets).m_p + uVar14 * 4) =
                   (int)piVar23 - *(int *)&(pmVar5->m_central_dir).m_p;
              if ((flags >> 0xb & 1) == 0) {
                *(int *)((long)(pmVar5->m_sorted_central_dir_offsets).m_p + uVar14 * 4) =
                     (int)uVar14;
              }
              uVar17 = (ulong)(uint)piVar23[5];
              uVar19 = (ulong)(uint)piVar23[6];
              if (pmVar5->m_zip64_has_extended_info_fields == 0) {
                uVar2 = *(ushort *)((long)piVar23 + 0x1e);
                __size = (ulong)uVar2;
                if (uVar2 == 0) goto LAB_001082b7;
                uVar15 = uVar19;
                if (uVar19 < uVar17) {
                  uVar15 = uVar17;
                }
                uVar8 = (uint)uVar15;
                if (uVar15 <= *(uint *)((long)piVar23 + 0x2a)) {
                  uVar8 = *(uint *)((long)piVar23 + 0x2a);
                }
                if (uVar8 != 0xffffffff) goto LAB_001082b7;
                uVar3 = *(ushort *)(piVar23 + 7);
                local_1070 = uVar19;
                local_1068 = uVar17;
                if ((uint)uVar2 + (uint)uVar3 + 0x2e <= uVar20) {
                  __ptr = (short *)((long)piVar23 + (ulong)uVar3 + 0x2e);
                  __ptr_00 = (short *)0x0;
LAB_0010820e:
                  do {
                    if ((uint)__size < 4) {
LAB_00108224:
                      free(__ptr_00);
                      pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
                      iVar13 = 1;
LAB_00108238:
                      bVar6 = false;
                    }
                    else {
                      puVar1 = (ushort *)(__ptr + 1);
                      uVar17 = (ulong)*puVar1 + 4;
                      if (__size < uVar17) goto LAB_00108224;
                      if (*__ptr == 1) {
                        pmVar5 = pZip->m_pState;
                        pmVar5->m_zip64 = 1;
                        pmVar5->m_zip64_has_extended_info_fields = 1;
                        iVar13 = 5;
                        goto LAB_00108238;
                      }
                      __ptr = (short *)((long)__ptr + uVar17);
                      iVar13 = 0;
                      bVar6 = true;
                      __size = (ulong)(((uint)__size - 4) - (uint)*puVar1);
                    }
                    if (iVar13 != 0) {
                      if (iVar13 != 5) {
                        uVar17 = local_1068;
                        uVar19 = local_1070;
                        if (bVar6) goto LAB_001082b7;
                        goto LAB_0010833a;
                      }
                      break;
                    }
                  } while ((int)__size != 0);
                  free(__ptr_00);
                  uVar17 = local_1068;
                  uVar19 = local_1070;
                  goto LAB_001082b7;
                }
                local_1060 = __size;
                __ptr = (short *)malloc(__size);
                sVar11 = local_1060;
                if (__ptr == (short *)0x0) {
                  pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
                }
                else {
                  sVar9 = (*pZip->m_pRead)(pZip->m_pIO_opaque,(ulong)uVar3 + uVar18 + 0x2e,__ptr,
                                           local_1060);
                  __ptr_00 = __ptr;
                  if (sVar9 == sVar11) goto LAB_0010820e;
                  free(__ptr);
                  pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
                }
                bVar6 = false;
              }
              else {
LAB_001082b7:
                iVar13 = (int)uVar17;
                if (((iVar13 == -1) || ((int)uVar19 == -1)) ||
                   (((*(int *)((long)piVar23 + 10) != 0 || ((int)uVar19 == iVar13)) &&
                    ((uVar19 == 0 || (uVar17 != 0)))))) {
                  uVar2 = *(ushort *)((long)piVar23 + 0x22);
                  if ((uVar2 != 0xffff) && (uVar2 == 1 || uVar2 == uVar22)) {
                    if ((iVar13 == -1) ||
                       (*(uint *)((long)piVar23 + 0x2a) + uVar17 + 0x1e <= pZip->m_archive_size)) {
                      if ((*(byte *)((long)piVar23 + 9) & 0x20) != 0) {
                        pZip->m_last_error = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
                        goto LAB_0010833a;
                      }
                      uVar8 = (uint)*(ushort *)(piVar23 + 8) +
                              (uint)*(ushort *)((long)piVar23 + 0x1e) +
                              (uint)*(ushort *)(piVar23 + 7) + 0x2e;
                      if (uVar8 <= uVar20) {
                        piVar23 = (int *)((long)piVar23 + (ulong)uVar8);
                        bVar6 = true;
                        uVar20 = uVar20 - uVar8;
                        goto LAB_0010833c;
                      }
                    }
                    goto LAB_00108333;
                  }
                  pZip->m_last_error = MZ_ZIP_UNSUPPORTED_MULTIDISK;
                }
                else {
LAB_00108333:
                  pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
                }
LAB_0010833a:
                bVar6 = false;
              }
LAB_0010833c:
              if (!bVar6) {
                return 0;
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 < pZip->m_total_files);
          }
          goto LAB_001083a9;
        }
        goto LAB_0010838a;
      }
    }
    pZip->m_last_error = MZ_ZIP_NOT_AN_ARCHIVE;
  }
  else {
LAB_0010838a:
    pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
  }
  return 0;
}

Assistant:

static mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip,
                                              mz_uint flags) {
  mz_uint cdir_size = 0, cdir_entries_on_this_disk = 0, num_this_disk = 0,
          cdir_disk_index = 0;
  mz_uint64 cdir_ofs = 0, eocd_ofs = 0, archive_ofs = 0;
  mz_int64 cur_file_ofs = 0;
  const mz_uint8 *p;

  mz_uint32 buf_u32[4096 / sizeof(mz_uint32)];
  mz_uint8 *pBuf = (mz_uint8 *)buf_u32;
  mz_bool sort_central_dir =
      ((flags & MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY) == 0);
  mz_uint32 zip64_end_of_central_dir_locator_u32
      [(MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE + sizeof(mz_uint32) - 1) /
       sizeof(mz_uint32)];
  mz_uint8 *pZip64_locator = (mz_uint8 *)zip64_end_of_central_dir_locator_u32;

  mz_uint32 zip64_end_of_central_dir_header_u32
      [(MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) /
       sizeof(mz_uint32)];
  mz_uint8 *pZip64_end_of_central_dir =
      (mz_uint8 *)zip64_end_of_central_dir_header_u32;

  mz_uint64 zip64_end_of_central_dir_ofs = 0;

  /* Basic sanity checks - reject files which are too small, and check the first
   * 4 bytes of the file to make sure a local header is there. */
  if (pZip->m_archive_size < MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
    return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

  if (!mz_zip_reader_locate_header_sig(
          pZip, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG,
          MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE, &cur_file_ofs))
    return mz_zip_set_error(pZip, MZ_ZIP_FAILED_FINDING_CENTRAL_DIR);

  eocd_ofs = cur_file_ofs;
  /* Read and verify the end of central directory record. */
  if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf,
                    MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
    return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

  if (MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_SIG_OFS) !=
      MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG)
    return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

  if (cur_file_ofs >= (MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE +
                       MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE)) {
    if (pZip->m_pRead(pZip->m_pIO_opaque,
                      cur_file_ofs - MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE,
                      pZip64_locator,
                      MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE) ==
        MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE) {
      if (MZ_READ_LE32(pZip64_locator + MZ_ZIP64_ECDL_SIG_OFS) ==
          MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIG) {
        pZip->m_pState->m_zip64 = MZ_TRUE;
      }
    }
  }

  if (pZip->m_pState->m_zip64) {
    /* Try locating the EOCD64 right before the EOCD64 locator. This works even
     * when the effective start of the zip header is not yet known. */
    if (cur_file_ofs < MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE +
                           MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE)
      return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

    zip64_end_of_central_dir_ofs = cur_file_ofs -
                                   MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE -
                                   MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE;

    if (!mz_zip_reader_eocd64_valid(pZip, zip64_end_of_central_dir_ofs,
                                    pZip64_end_of_central_dir)) {
      /* That failed, try reading where the locator tells us to. */
      zip64_end_of_central_dir_ofs = MZ_READ_LE64(
          pZip64_locator + MZ_ZIP64_ECDL_REL_OFS_TO_ZIP64_ECDR_OFS);

      if (zip64_end_of_central_dir_ofs >
          (pZip->m_archive_size - MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE))
        return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

      if (!mz_zip_reader_eocd64_valid(pZip, zip64_end_of_central_dir_ofs,
                                      pZip64_end_of_central_dir))
        return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);
    }
  }

  pZip->m_total_files = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_TOTAL_ENTRIES_OFS);
  cdir_entries_on_this_disk =
      MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS);
  num_this_disk = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_THIS_DISK_OFS);
  cdir_disk_index = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_DISK_CDIR_OFS);
  cdir_size = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_SIZE_OFS);
  cdir_ofs = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_OFS_OFS);

  if (pZip->m_pState->m_zip64) {
    mz_uint32 zip64_total_num_of_disks =
        MZ_READ_LE32(pZip64_locator + MZ_ZIP64_ECDL_TOTAL_NUMBER_OF_DISKS_OFS);
    mz_uint64 zip64_cdir_total_entries = MZ_READ_LE64(
        pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_TOTAL_ENTRIES_OFS);
    mz_uint64 zip64_cdir_total_entries_on_this_disk = MZ_READ_LE64(
        pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS);
    mz_uint64 zip64_size_of_end_of_central_dir_record = MZ_READ_LE64(
        pZip64_end_of_central_dir + MZ_ZIP64_ECDH_SIZE_OF_RECORD_OFS);
    mz_uint64 zip64_size_of_central_directory =
        MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_SIZE_OFS);

    if (zip64_size_of_end_of_central_dir_record <
        (MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE - 12))
      return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    if (zip64_total_num_of_disks != 1U)
      return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

    /* Check for miniz's practical limits */
    if (zip64_cdir_total_entries > MZ_UINT32_MAX)
      return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);

    pZip->m_total_files = (mz_uint32)zip64_cdir_total_entries;

    if (zip64_cdir_total_entries_on_this_disk > MZ_UINT32_MAX)
      return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);

    cdir_entries_on_this_disk =
        (mz_uint32)zip64_cdir_total_entries_on_this_disk;

    /* Check for miniz's current practical limits (sorry, this should be enough
     * for millions of files) */
    if (zip64_size_of_central_directory > MZ_UINT32_MAX)
      return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    cdir_size = (mz_uint32)zip64_size_of_central_directory;

    num_this_disk = MZ_READ_LE32(pZip64_end_of_central_dir +
                                 MZ_ZIP64_ECDH_NUM_THIS_DISK_OFS);

    cdir_disk_index = MZ_READ_LE32(pZip64_end_of_central_dir +
                                   MZ_ZIP64_ECDH_NUM_DISK_CDIR_OFS);

    cdir_ofs =
        MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_OFS_OFS);
  }

  if (pZip->m_total_files != cdir_entries_on_this_disk)
    return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

  if (((num_this_disk | cdir_disk_index) != 0) &&
      ((num_this_disk != 1) || (cdir_disk_index != 1)))
    return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

  if (cdir_size <
      (mz_uint64)pZip->m_total_files * MZ_ZIP_CENTRAL_DIR_HEADER_SIZE)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

  if ((cdir_ofs + (mz_uint64)cdir_size) > pZip->m_archive_size)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

  if (eocd_ofs < cdir_ofs + cdir_size)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

  /* The end of central dir follows the central dir, unless the zip file has
   * some trailing data (e.g. it is appended to an executable file). */
  archive_ofs = eocd_ofs - (cdir_ofs + cdir_size);
  if (pZip->m_pState->m_zip64) {
    if (archive_ofs < MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE +
                          MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE)
      return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    archive_ofs -= MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE +
                   MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE;
  }

  /* Update the archive start position, but only if not specified. */
  if ((pZip->m_zip_type == MZ_ZIP_TYPE_FILE ||
       pZip->m_zip_type == MZ_ZIP_TYPE_CFILE) &&
      pZip->m_pState->m_file_archive_start_ofs == 0) {
    pZip->m_pState->m_file_archive_start_ofs = archive_ofs;
    pZip->m_archive_size -= archive_ofs;
  }

  pZip->m_central_directory_file_ofs = cdir_ofs;

  if (pZip->m_total_files) {
    mz_uint i, n;
    /* Read the entire central directory into a heap block, and allocate another
     * heap block to hold the unsorted central dir file record offsets, and
     * possibly another to hold the sorted indices. */
    if ((!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir, cdir_size,
                              MZ_FALSE)) ||
        (!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir_offsets,
                              pZip->m_total_files, MZ_FALSE)))
      return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    if (sort_central_dir) {
      if (!mz_zip_array_resize(pZip,
                               &pZip->m_pState->m_sorted_central_dir_offsets,
                               pZip->m_total_files, MZ_FALSE))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    if (pZip->m_pRead(pZip->m_pIO_opaque, cdir_ofs,
                      pZip->m_pState->m_central_dir.m_p,
                      cdir_size) != cdir_size)
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    /* Now create an index into the central directory file records, do some
     * basic sanity checking on each record */
    p = (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p;
    for (n = cdir_size, i = 0; i < pZip->m_total_files; ++i) {
      mz_uint total_header_size, disk_index, bit_flags, filename_size,
          ext_data_size;
      mz_uint64 comp_size, decomp_size, local_header_ofs;

      if ((n < MZ_ZIP_CENTRAL_DIR_HEADER_SIZE) ||
          (MZ_READ_LE32(p) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

      MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32,
                           i) =
          (mz_uint32)(p - (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p);

      if (sort_central_dir)
        MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_sorted_central_dir_offsets,
                             mz_uint32, i) = i;

      comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
      decomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);
      local_header_ofs = MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS);
      filename_size = MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);
      ext_data_size = MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS);

      if ((!pZip->m_pState->m_zip64_has_extended_info_fields) &&
          (ext_data_size) &&
          (MZ_MAX(MZ_MAX(comp_size, decomp_size), local_header_ofs) ==
           MZ_UINT32_MAX)) {
        /* Attempt to find zip64 extended information field in the entry's extra
         * data */
        mz_uint32 extra_size_remaining = ext_data_size;

        if (extra_size_remaining) {
          const mz_uint8 *pExtra_data;
          void *buf = NULL;

          if (MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size + ext_data_size >
              n) {
            buf = MZ_MALLOC(ext_data_size);
            if (buf == NULL)
              return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

            if (pZip->m_pRead(pZip->m_pIO_opaque,
                              cdir_ofs + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
                                  filename_size,
                              buf, ext_data_size) != ext_data_size) {
              MZ_FREE(buf);
              return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            }

            pExtra_data = (mz_uint8 *)buf;
          } else {
            pExtra_data = p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size;
          }

          do {
            mz_uint32 field_id;
            mz_uint32 field_data_size;

            if (extra_size_remaining < (sizeof(mz_uint16) * 2)) {
              MZ_FREE(buf);
              return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            field_id = MZ_READ_LE16(pExtra_data);
            field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));

            if ((field_data_size + sizeof(mz_uint16) * 2) >
                extra_size_remaining) {
              MZ_FREE(buf);
              return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID) {
              /* Ok, the archive didn't have any zip64 headers but it uses a
               * zip64 extended information field so mark it as zip64 anyway
               * (this can occur with infozip's zip util when it reads
               * compresses files from stdin). */
              pZip->m_pState->m_zip64 = MZ_TRUE;
              pZip->m_pState->m_zip64_has_extended_info_fields = MZ_TRUE;
              break;
            }

            pExtra_data += sizeof(mz_uint16) * 2 + field_data_size;
            extra_size_remaining =
                extra_size_remaining - sizeof(mz_uint16) * 2 - field_data_size;
          } while (extra_size_remaining);

          MZ_FREE(buf);
        }
      }

      /* I've seen archives that aren't marked as zip64 that uses zip64 ext
       * data, argh */
      if ((comp_size != MZ_UINT32_MAX) && (decomp_size != MZ_UINT32_MAX)) {
        if (((!MZ_READ_LE32(p + MZ_ZIP_CDH_METHOD_OFS)) &&
             (decomp_size != comp_size)) ||
            (decomp_size && !comp_size))
          return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
      }

      disk_index = MZ_READ_LE16(p + MZ_ZIP_CDH_DISK_START_OFS);
      if ((disk_index == MZ_UINT16_MAX) ||
          ((disk_index != num_this_disk) && (disk_index != 1)))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

      if (comp_size != MZ_UINT32_MAX) {
        if (((mz_uint64)MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS) +
             MZ_ZIP_LOCAL_DIR_HEADER_SIZE + comp_size) > pZip->m_archive_size)
          return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
      }

      bit_flags = MZ_READ_LE16(p + MZ_ZIP_CDH_BIT_FLAG_OFS);
      if (bit_flags & MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_LOCAL_DIR_IS_MASKED)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);

      if ((total_header_size = MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS) +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS) +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_COMMENT_LEN_OFS)) >
          n)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

      n -= total_header_size;
      p += total_header_size;
    }
  }

  if (sort_central_dir)
    mz_zip_reader_sort_central_dir_offsets_by_filename(pZip);

  return MZ_TRUE;
}